

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::IsWindowHovered(ImGuiHoveredFlags flags)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  uint uVar3;
  uint in_EDI;
  ImGuiContext *g;
  bool local_1;
  
  pIVar1 = GImGui;
  if ((in_EDI & 4) == 0) {
    uVar3 = in_EDI & 3;
    if (uVar3 == 1) {
      if ((GImGui->HoveredWindow == (ImGuiWindow *)0x0) ||
         (bVar2 = IsWindowChildOf(GImGui->HoveredWindow,GImGui->CurrentWindow), !bVar2)) {
        return false;
      }
    }
    else if (uVar3 == 2) {
      if (GImGui->HoveredWindow != GImGui->CurrentWindow->RootWindowDockStop) {
        return false;
      }
    }
    else if (uVar3 == 3) {
      if ((GImGui->HoveredWindow == (ImGuiWindow *)0x0) ||
         (GImGui->HoveredWindow->RootWindowDockStop != GImGui->CurrentWindow->RootWindowDockStop)) {
        return false;
      }
    }
    else if (GImGui->HoveredWindow != GImGui->CurrentWindow) {
      return false;
    }
  }
  else if (GImGui->HoveredWindow == (ImGuiWindow *)0x0) {
    return false;
  }
  bVar2 = IsWindowContentHoverable(pIVar1->HoveredWindow,in_EDI);
  if (bVar2) {
    if (((((in_EDI & 0x20) == 0) && (pIVar1->ActiveId != 0)) &&
        ((pIVar1->ActiveIdAllowOverlap & 1U) == 0)) &&
       (pIVar1->ActiveId != pIVar1->HoveredWindow->MoveId)) {
      local_1 = false;
    }
    else {
      local_1 = true;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::IsWindowHovered(ImGuiHoveredFlags flags)
{
    IM_ASSERT((flags & ImGuiHoveredFlags_AllowWhenOverlapped) == 0);   // Flags not supported by this function
    ImGuiContext& g = *GImGui;

    if (flags & ImGuiHoveredFlags_AnyWindow)
    {
        if (g.HoveredWindow == NULL)
            return false;
    }
    else
    {
        switch (flags & (ImGuiHoveredFlags_RootWindow | ImGuiHoveredFlags_ChildWindows))
        {
        case ImGuiHoveredFlags_RootWindow | ImGuiHoveredFlags_ChildWindows:
            if (g.HoveredWindow == NULL || g.HoveredWindow->RootWindowDockStop != g.CurrentWindow->RootWindowDockStop)
                return false;
            break;
        case ImGuiHoveredFlags_RootWindow:
            if (g.HoveredWindow != g.CurrentWindow->RootWindowDockStop)
                return false;
            break;
        case ImGuiHoveredFlags_ChildWindows:
            if (g.HoveredWindow == NULL || !IsWindowChildOf(g.HoveredWindow, g.CurrentWindow))
                return false;
            break;
        default:
            if (g.HoveredWindow != g.CurrentWindow)
                return false;
            break;
        }
    }

    if (!IsWindowContentHoverable(g.HoveredWindow, flags))
        return false;
    if (!(flags & ImGuiHoveredFlags_AllowWhenBlockedByActiveItem))
        if (g.ActiveId != 0 && !g.ActiveIdAllowOverlap && g.ActiveId != g.HoveredWindow->MoveId)
            return false;
    return true;
}